

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void add_passes(Backend *backend)

{
  vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
  *this;
  vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
  *this_00;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_190;
  bool local_188 [7];
  undefined1 local_181;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_180;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_178;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_170;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_168;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_160;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_158;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_150;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_148;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_140;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_138;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_130;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_128;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_120;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_118;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_110;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_108;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_100;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_f8;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_f0;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_e8;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_e0;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_d8;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_d0;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_c8;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_c0;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_b8;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_b0;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_a8;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_a0;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_98;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_90;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_88;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_80;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_78;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_70;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_68;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_60;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_58;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_50;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_48;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_40;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_38;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_30;
  _Head_base<0UL,_optimization::sanity_check::SanityCheck_*,_false> local_28;
  _Head_base<0UL,_backend::MirOptimizePass_*,_false> local_20;
  
  std::make_unique<optimization::sanity_check::SanityCheck>();
  local_20._M_head_impl = &(local_190._M_head_impl)->super_MirOptimizePass;
  local_190._M_head_impl = (SanityCheck *)0x0;
  this = &backend->mir_passes;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_20);
  if (local_20._M_head_impl != (MirOptimizePass *)0x0) {
    (*(local_20._M_head_impl)->_vptr_MirOptimizePass[3])();
  }
  local_20._M_head_impl = (MirOptimizePass *)0x0;
  std::
  unique_ptr<optimization::sanity_check::SanityCheck,_std::default_delete<optimization::sanity_check::SanityCheck>_>
  ::~unique_ptr((unique_ptr<optimization::sanity_check::SanityCheck,_std::default_delete<optimization::sanity_check::SanityCheck>_>
                 *)&local_190);
  std::make_unique<optimization::remove_temp_var::Remove_Temp_Var>();
  local_28._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_28);
  if (local_28._M_head_impl != (SanityCheck *)0x0) {
    (*((local_28._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_28._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  local_30._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_30);
  if (local_30._M_head_impl != (SanityCheck *)0x0) {
    (*((local_30._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_30._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::var_mir_fold::VarMirFold>();
  local_38._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_38);
  if (local_38._M_head_impl != (SanityCheck *)0x0) {
    (*((local_38._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_38._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<optimization::var_mir_fold::VarMirFold,_std::default_delete<optimization::var_mir_fold::VarMirFold>_>
  ::~unique_ptr((unique_ptr<optimization::var_mir_fold::VarMirFold,_std::default_delete<optimization::var_mir_fold::VarMirFold>_>
                 *)&local_190);
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  local_40._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_40);
  if (local_40._M_head_impl != (SanityCheck *)0x0) {
    (*((local_40._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_40._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::inlineFunc::Inline_Func>();
  local_48._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_48);
  if (local_48._M_head_impl != (SanityCheck *)0x0) {
    (*((local_48._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_48._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::mergeBlocks::Merge_Block>();
  local_50._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_50);
  if (local_50._M_head_impl != (SanityCheck *)0x0) {
    (*((local_50._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_50._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::common_expr_del::Common_Expr_Del>();
  local_58._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_58);
  if (local_58._M_head_impl != (SanityCheck *)0x0) {
    (*((local_58._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_58._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::global_expr_move::Global_Expr_Mov>();
  local_60._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_60);
  if (local_60._M_head_impl != (SanityCheck *)0x0) {
    (*((local_60._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_60._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::common_expr_del::Common_Expr_Del>();
  local_68._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_68);
  if (local_68._M_head_impl != (SanityCheck *)0x0) {
    (*((local_68._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_68._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  local_70._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_70);
  if (local_70._M_head_impl != (SanityCheck *)0x0) {
    (*((local_70._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_70._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation>();
  local_78._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_78);
  if (local_78._M_head_impl != (SanityCheck *)0x0) {
    (*((local_78._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_78._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_merge::Merge_Const>();
  local_80._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_80);
  if (local_80._M_head_impl != (SanityCheck *)0x0) {
    (*((local_80._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_80._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation>();
  local_88._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_88);
  if (local_88._M_head_impl != (SanityCheck *)0x0) {
    (*((local_88._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_88._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  local_90._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_90);
  if (local_90._M_head_impl != (SanityCheck *)0x0) {
    (*((local_90._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_90._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::loop_expand::Const_Loop_Expand>();
  local_98._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_98);
  if (local_98._M_head_impl != (SanityCheck *)0x0) {
    (*((local_98._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_98._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<optimization::loop_expand::Const_Loop_Expand,_std::default_delete<optimization::loop_expand::Const_Loop_Expand>_>
  ::~unique_ptr((unique_ptr<optimization::loop_expand::Const_Loop_Expand,_std::default_delete<optimization::loop_expand::Const_Loop_Expand>_>
                 *)&local_190);
  std::make_unique<optimization::mergeBlocks::Merge_Block>();
  local_a0._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_a0);
  if (local_a0._M_head_impl != (SanityCheck *)0x0) {
    (*((local_a0._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_a0._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  local_a8._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_a8);
  if (local_a8._M_head_impl != (SanityCheck *)0x0) {
    (*((local_a8._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_a8._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_merge::Merge_Const>();
  local_b0._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_b0);
  if (local_b0._M_head_impl != (SanityCheck *)0x0) {
    (*((local_b0._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_b0._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  local_b8._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_b8);
  if (local_b8._M_head_impl != (SanityCheck *)0x0) {
    (*((local_b8._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_b8._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  local_c0._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_c0);
  if (local_c0._M_head_impl != (SanityCheck *)0x0) {
    (*((local_c0._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_c0._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::common_expr_del::Common_Expr_Del>();
  local_c8._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_c8);
  if (local_c8._M_head_impl != (SanityCheck *)0x0) {
    (*((local_c8._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_c8._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation>();
  local_d0._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_d0);
  if (local_d0._M_head_impl != (SanityCheck *)0x0) {
    (*((local_d0._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_d0._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  local_d8._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_d8);
  if (local_d8._M_head_impl != (SanityCheck *)0x0) {
    (*((local_d8._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_d8._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_merge::Merge_Const>();
  local_e0._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_e0);
  if (local_e0._M_head_impl != (SanityCheck *)0x0) {
    (*((local_e0._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_e0._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  local_e8._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_e8);
  if (local_e8._M_head_impl != (SanityCheck *)0x0) {
    (*((local_e8._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_e8._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::cast_inst::Cast_Inst>();
  local_f0._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_f0);
  if (local_f0._M_head_impl != (SanityCheck *)0x0) {
    (*((local_f0._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_f0._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_188[0] = true;
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation,bool>
            ((bool *)&local_190);
  local_f8._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_f8);
  if (local_f8._M_head_impl != (SanityCheck *)0x0) {
    (*((local_f8._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_f8._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_188[0] = true;
  std::make_unique<optimization::common_expr_del::Common_Expr_Del,bool>((bool *)&local_190);
  local_100._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_100);
  if (local_100._M_head_impl != (SanityCheck *)0x0) {
    (*((local_100._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_100._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_188[0] = true;
  std::make_unique<optimization::global_expr_move::Global_Expr_Mov,bool>((bool *)&local_190);
  local_108._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_108);
  if (local_108._M_head_impl != (SanityCheck *)0x0) {
    (*((local_108._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_108._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  local_110._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_110);
  if (local_110._M_head_impl != (SanityCheck *)0x0) {
    (*((local_110._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_110._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::algebraic_simplification::AlgebraicSimplification>();
  local_118._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_118);
  if (local_118._M_head_impl != (SanityCheck *)0x0) {
    (*((local_118._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_118._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::value_shift_collapse::ValueShiftCollapse>();
  local_120._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_120);
  if (local_120._M_head_impl != (SanityCheck *)0x0) {
    (*((local_120._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_120._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<optimization::value_shift_collapse::ValueShiftCollapse,_std::default_delete<optimization::value_shift_collapse::ValueShiftCollapse>_>
  ::~unique_ptr((unique_ptr<optimization::value_shift_collapse::ValueShiftCollapse,_std::default_delete<optimization::value_shift_collapse::ValueShiftCollapse>_>
                 *)&local_190);
  std::make_unique<optimization::mla::MlaPass>();
  local_128._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_128);
  if (local_128._M_head_impl != (SanityCheck *)0x0) {
    (*((local_128._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_128._M_head_impl = (SanityCheck *)0x0;
  std::unique_ptr<optimization::mla::MlaPass,_std::default_delete<optimization::mla::MlaPass>_>::
  ~unique_ptr((unique_ptr<optimization::mla::MlaPass,_std::default_delete<optimization::mla::MlaPass>_>
               *)&local_190);
  std::make_unique<backend::codegen::BasicBlkRearrange>();
  local_130._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_130);
  if (local_130._M_head_impl != (SanityCheck *)0x0) {
    (*((local_130._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_130._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
  ::~unique_ptr((unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
                 *)&local_190);
  std::make_unique<optimization::complex_dce::ComplexDeadCodeElimination>();
  local_138._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_138);
  if (local_138._M_head_impl != (SanityCheck *)0x0) {
    (*((local_138._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_138._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<optimization::complex_dce::ComplexDeadCodeElimination,_std::default_delete<optimization::complex_dce::ComplexDeadCodeElimination>_>
  ::~unique_ptr((unique_ptr<optimization::complex_dce::ComplexDeadCodeElimination,_std::default_delete<optimization::complex_dce::ComplexDeadCodeElimination>_>
                 *)&local_190);
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  local_140._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_140);
  if (local_140._M_head_impl != (SanityCheck *)0x0) {
    (*((local_140._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_140._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::mergeBlocks::Merge_Block>();
  local_148._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_148);
  if (local_148._M_head_impl != (SanityCheck *)0x0) {
    (*((local_148._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_148._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<optimization::func_array_global::Func_Array_Global>();
  local_150._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_150);
  if (local_150._M_head_impl != (SanityCheck *)0x0) {
    (*((local_150._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_150._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<optimization::func_array_global::Func_Array_Global,_std::default_delete<optimization::func_array_global::Func_Array_Global>_>
  ::~unique_ptr((unique_ptr<optimization::func_array_global::Func_Array_Global,_std::default_delete<optimization::func_array_global::Func_Array_Global>_>
                 *)&local_190);
  std::make_unique<backend::codegen::BasicBlkRearrange>();
  local_158._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_158);
  if (local_158._M_head_impl != (SanityCheck *)0x0) {
    (*((local_158._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_158._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
  ::~unique_ptr((unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
                 *)&local_190);
  std::make_unique<optimization::ref_count::Ref_Count>();
  local_160._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_160);
  if (local_160._M_head_impl != (SanityCheck *)0x0) {
    (*((local_160._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_160._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_188[0] = true;
  local_188[1] = false;
  local_188[2] = false;
  local_188[3] = false;
  local_181 = 1;
  std::make_unique<optimization::graph_color::Graph_Color,int,bool>((int *)&local_190,local_188);
  local_168._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_168);
  if (local_168._M_head_impl != (SanityCheck *)0x0) {
    (*((local_168._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_168._M_head_impl = (SanityCheck *)0x0;
  if (local_190._M_head_impl != (SanityCheck *)0x0) {
    (*((local_190._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  std::make_unique<backend::codegen::MathOptimization>();
  local_170._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  this_00 = &backend->arm_passes;
  std::
  vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>
            ((vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
              *)this_00,
             (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )&local_170);
  if (local_170._M_head_impl != (SanityCheck *)0x0) {
    (*((local_170._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_170._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<backend::codegen::MathOptimization,_std::default_delete<backend::codegen::MathOptimization>_>
  ::~unique_ptr((unique_ptr<backend::codegen::MathOptimization,_std::default_delete<backend::codegen::MathOptimization>_>
                 *)&local_190);
  std::make_unique<backend::codegen::RegAllocatePass>();
  local_178._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>
            ((vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
              *)this_00,
             (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )&local_178);
  if (local_178._M_head_impl != (SanityCheck *)0x0) {
    (*((local_178._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_178._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<backend::codegen::RegAllocatePass,_std::default_delete<backend::codegen::RegAllocatePass>_>
  ::~unique_ptr((unique_ptr<backend::codegen::RegAllocatePass,_std::default_delete<backend::codegen::RegAllocatePass>_>
                 *)&local_190);
  std::make_unique<backend::optimization::ExcessRegDelete>();
  local_180._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (SanityCheck *)0x0;
  std::
  vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>
            ((vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
              *)this_00,
             (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )&local_180);
  if (local_180._M_head_impl != (SanityCheck *)0x0) {
    (*((local_180._M_head_impl)->super_MirOptimizePass)._vptr_MirOptimizePass[3])();
  }
  local_180._M_head_impl = (SanityCheck *)0x0;
  std::
  unique_ptr<backend::optimization::ExcessRegDelete,_std::default_delete<backend::optimization::ExcessRegDelete>_>
  ::~unique_ptr((unique_ptr<backend::optimization::ExcessRegDelete,_std::default_delete<backend::optimization::ExcessRegDelete>_>
                 *)&local_190);
  return;
}

Assistant:

void add_passes(backend::Backend& backend) {
  backend.add_pass(std::make_unique<optimization::sanity_check::SanityCheck>());
  backend.add_pass(
      std::make_unique<optimization::remove_temp_var::Remove_Temp_Var>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::var_mir_fold::VarMirFold>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(std::make_unique<optimization::inlineFunc::Inline_Func>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  // inside block only and remove tmp vars
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());

  backend.add_pass(
      std::make_unique<optimization::global_expr_move::Global_Expr_Mov>());

  // delete common exprs new created and replace not phi vars
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());

  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  // backend.add_pass(
  //     std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<optimization::loop_expand::Const_Loop_Expand>());
  // backend.add_pass(
  //     std::make_unique<optimization::loop_unrolling::Loop_Unrolling>());
  // backend.add_pass(
  //     std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  // backend.add_pass(
  //     std::make_unique<optimization::common_expr_del::Common_Expr_Del>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());

  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::cast_inst::Cast_Inst>());
  backend.add_pass(
      std::make_unique<
          optimization::memvar_propagation::Memory_Var_Propagation>(true));
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>(true));
  backend.add_pass(
      std::make_unique<optimization::global_expr_move::Global_Expr_Mov>(true));
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<
          optimization::algebraic_simplification::AlgebraicSimplification>());
  backend.add_pass(std::make_unique<
                   optimization::value_shift_collapse::ValueShiftCollapse>());
  backend.add_pass(std::make_unique<optimization::mla::MlaPass>());
  backend.add_pass(std::make_unique<backend::codegen::BasicBlkRearrange>());
  backend.add_pass(std::make_unique<
                   optimization::complex_dce::ComplexDeadCodeElimination>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  // backend.add_pass(std::make_unique<optimization::cycle::Cycle>());
  // backend.add_pass(std::make_unique<optimization::exit_ahead::Exit_Ahead>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  backend.add_pass(
      std::make_unique<optimization::func_array_global::Func_Array_Global>());
  backend.add_pass(std::make_unique<backend::codegen::BasicBlkRearrange>());
  // fft will error.
  // backend.add_pass(std::make_unique<
  //                  optimization::global_var_to_local::Global_Var_to_Local>());
  backend.add_pass(std::make_unique<optimization::ref_count::Ref_Count>());
  backend.add_pass(
      std::make_unique<optimization::graph_color::Graph_Color>(7, true));

  // ARM Passes
  backend.add_pass(std::make_unique<backend::codegen::MathOptimization>());
  backend.add_pass(std::make_unique<backend::codegen::RegAllocatePass>());
  backend.add_pass(std::make_unique<backend::optimization::ExcessRegDelete>());
  // backend.add_pass(std::make_unique<backend::codegen::CodeAlignOptimization>());
}